

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file_handle.cpp
# Opt level: O2

void __thiscall
SplitFixture_Small_Test<const_unsigned_char>::TestBody
          (SplitFixture_Small_Test<const_unsigned_char> *this)

{
  TypedExpectation<unsigned_long_(const_void_*,_unsigned_long)> *pTVar1;
  mock_callback *this_00;
  char *message;
  MatcherBase<unsigned_long> local_c0;
  MatcherBase<const_void_*> local_a8;
  ReturnAction<unsigned_long> local_90;
  size_t size;
  TypeParam buffer [10];
  size_t total;
  AssertionResult gtest_ar;
  
  buffer[8] = '\0';
  buffer[9] = '\0';
  size = 10;
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  testing::Matcher<const_void_*>::Matcher((Matcher<const_void_*> *)&local_a8,buffer);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_c0,10);
  this_00 = &(this->super_SplitFixture<const_unsigned_char>).callback;
  anon_unknown.dwarf_7f495::SplitFixture<const_unsigned_char>::mock_callback::gmock_call
            ((MockSpec<unsigned_long_(const_void_*,_unsigned_long)> *)&gtest_ar,this_00,
             (Matcher<const_void_*> *)&local_a8,(Matcher<unsigned_long> *)&local_c0);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<unsigned_long_(const_void_*,_unsigned_long)>::
           InternalExpectedAt((MockSpec<unsigned_long_(const_void_*,_unsigned_long)> *)&gtest_ar,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file_handle.cpp"
                              ,0x40,"this->callback","call (buffer, size)");
  pTVar1 = testing::internal::TypedExpectation<unsigned_long_(const_void_*,_unsigned_long)>::Times
                     (pTVar1,1);
  testing::internal::ReturnAction<unsigned_long>::ReturnAction(&local_90,10);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_long_(const_void_*,_unsigned_long)> *)&total,(ReturnAction *)&local_90
            );
  testing::internal::TypedExpectation<unsigned_long_(const_void_*,_unsigned_long)>::WillOnce
            (pTVar1,(Action<unsigned_long_(const_void_*,_unsigned_long)> *)&total);
  std::_Function_base::~_Function_base((_Function_base *)&total);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_90.value_.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Tuple_impl<0UL,_testing::Matcher<const_void_*>,_testing::Matcher<unsigned_long>_>::
  ~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<const_void_*>,_testing::Matcher<unsigned_long>_> *
               )&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_c0);
  testing::internal::MatcherBase<const_void_*>::~MatcherBase(&local_a8);
  total = pstore::file::details::
          split<unsigned_short,unsigned_char_const,(anonymous_namespace)::SplitFixture<unsigned_char_const>::mock_callback>
                    (buffer,10,this_00);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size","total",&size,&total);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file_handle.cpp"
               ,0x44,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if (local_a8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
        (_func_int **)0x0) {
      (**(code **)(*local_a8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8))()
      ;
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TYPED_TEST (SplitFixture, Small) {
    constexpr std::size_t size{10};
    TypeParam buffer[size] = {};

    using ::testing::Return;
    EXPECT_CALL (this->callback, call (buffer, size)).Times (1).WillOnce (Return (size));

    using pstore::file::details::split;
    std::size_t const total = split<std::uint16_t> (buffer, sizeof (buffer), this->callback);
    EXPECT_EQ (size, total);
}